

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall xray_re::xr_bone::load_0(xr_bone *this,xr_reader *r)

{
  undefined8 uVar1;
  float *pfVar2;
  
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::r_sz(r,&this->m_parent_name);
  xr_reader::r_sz(r,&this->m_vmap_name);
  xr_reader::r_fvector3(r,&this->m_bind_offset);
  xr_reader::r_fvector3(r,&this->m_bind_rotate);
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  this->m_bind_length = *pfVar2;
  uVar1 = *(undefined8 *)&(this->m_bind_offset).field_0;
  *(ulong *)&(this->m_bind_offset).field_0 = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                ,0x3a,"void xray_re::xr_bone::load_0(xr_reader &)");
}

Assistant:

void xr_bone::load_0(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	r.r_sz(m_vmap_name);
	r.r_fvector3(m_bind_offset);
	r.r_fvector3(m_bind_rotate);
	m_bind_length = r.r_float();
	std::swap(m_bind_offset.x, m_bind_offset.y);

	// FIXME: reset other fields
	xr_not_implemented();
}